

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = DebugCallback;
  local_10 = std::
             _Function_handler<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&),_void_(*)(const_std::basic_string_view<char,_std::char_traits<char>_>_&)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&),_void_(*)(const_std::basic_string_view<char,_std::char_traits<char>_>_&)>
             ::_M_manager;
  KV::setDebugCallback
            ((function<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&)> *)
             local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  SerializeTest();
  ParseFileTest();
  ParseStringTest();
  ParseErrorTest();
  return 0;
}

Assistant:

int main()
{
#ifdef _WIN32
	SetConsoleOutputCP( CP_UTF8 );
#endif

	KV::setDebugCallback( &DebugCallback );

	SerializeTest();
	ParseFileTest();
	ParseStringTest();
	ParseErrorTest();

	return 0;
}